

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

_Bool al_drop_next_event(ALLEGRO_EVENT_QUEUE *queue)

{
  ALLEGRO_EVENT *pAVar1;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  ALLEGRO_EVENT *next_event;
  undefined8 in_stack_fffffffffffffff0;
  undefined1 delete;
  
  delete = (undefined1)((ulong)in_stack_fffffffffffffff0 >> 0x38);
  heartbeat();
  _al_mutex_lock((_AL_MUTEX *)0x17465c);
  pAVar1 = get_next_event_if_any(in_RDI,(_Bool)delete);
  if (pAVar1 != (ALLEGRO_EVENT *)0x0) {
    unref_if_user_event((ALLEGRO_EVENT *)0x174682);
  }
  _al_mutex_unlock((_AL_MUTEX *)0x174690);
  return pAVar1 != (ALLEGRO_EVENT *)0x0;
}

Assistant:

bool al_drop_next_event(ALLEGRO_EVENT_QUEUE *queue)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, true);
   if (next_event) {
      unref_if_user_event(next_event);
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}